

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NetworkBroker_impl.hpp
# Opt level: O2

bool __thiscall
helics::NetworkBroker<helics::inproc::InprocComms,_(gmlc::networking::InterfaceTypes)4,_18>::
brokerConnect(NetworkBroker<helics::inproc::InprocComms,_(gmlc::networking::InterfaceTypes)4,_18>
              *this)

{
  bool bVar1;
  int iVar2;
  milliseconds timeOut;
  socklen_t __len;
  sockaddr *__addr;
  
  CLI::std::mutex::lock(&this->dataMutex);
  if ((this->netInfo).brokerAddress._M_string_length == 0 &&
      (this->netInfo).brokerName._M_string_length == 0) {
    CoreBroker::setAsRoot((CoreBroker *)this);
  }
  bVar1 = (this->super_CommsBroker<helics::inproc::InprocComms,_helics::CoreBroker>).
          super_CoreBroker.super_BrokerBase.observer;
  (this->netInfo).useJsonSerialization =
       (this->super_CommsBroker<helics::inproc::InprocComms,_helics::CoreBroker>).super_CoreBroker.
       super_BrokerBase.useJsonSerialization;
  (this->netInfo).observer = bVar1;
  CommsInterface::setName
            (&((this->super_CommsBroker<helics::inproc::InprocComms,_helics::CoreBroker>).comms._M_t
               .
               super___uniq_ptr_impl<helics::inproc::InprocComms,_std::default_delete<helics::inproc::InprocComms>_>
               ._M_t.
               super__Tuple_impl<0UL,_helics::inproc::InprocComms_*,_std::default_delete<helics::inproc::InprocComms>_>
               .super__Head_base<0UL,_helics::inproc::InprocComms_*,_false>._M_head_impl)->
              super_CommsInterface,
             (string *)
             &(this->super_CommsBroker<helics::inproc::InprocComms,_helics::CoreBroker>).
              super_CoreBroker.super_BrokerBase.identifier);
  inproc::InprocComms::loadNetworkInfo
            ((this->super_CommsBroker<helics::inproc::InprocComms,_helics::CoreBroker>).comms._M_t.
             super___uniq_ptr_impl<helics::inproc::InprocComms,_std::default_delete<helics::inproc::InprocComms>_>
             ._M_t.
             super__Tuple_impl<0UL,_helics::inproc::InprocComms_*,_std::default_delete<helics::inproc::InprocComms>_>
             .super__Head_base<0UL,_helics::inproc::InprocComms_*,_false>._M_head_impl,
             &this->netInfo);
  __len = 1000000;
  timeOut.__r = (this->super_CommsBroker<helics::inproc::InprocComms,_helics::CoreBroker>).
                super_CoreBroker.super_BrokerBase.networkTimeout.internalTimeCode / 1000000;
  CommsInterface::setTimeout
            (&((this->super_CommsBroker<helics::inproc::InprocComms,_helics::CoreBroker>).comms._M_t
               .
               super___uniq_ptr_impl<helics::inproc::InprocComms,_std::default_delete<helics::inproc::InprocComms>_>
               ._M_t.
               super__Tuple_impl<0UL,_helics::inproc::InprocComms_*,_std::default_delete<helics::inproc::InprocComms>_>
               .super__Head_base<0UL,_helics::inproc::InprocComms_*,_false>._M_head_impl)->
              super_CommsInterface,timeOut);
  iVar2 = CommsInterface::connect
                    (&((this->super_CommsBroker<helics::inproc::InprocComms,_helics::CoreBroker>).
                       comms._M_t.
                       super___uniq_ptr_impl<helics::inproc::InprocComms,_std::default_delete<helics::inproc::InprocComms>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_helics::inproc::InprocComms_*,_std::default_delete<helics::inproc::InprocComms>_>
                       .super__Head_base<0UL,_helics::inproc::InprocComms_*,_false>._M_head_impl)->
                      super_CommsInterface,(int)timeOut.__r,__addr,__len);
  if ((SUB41(iVar2,0) != false) && ((this->netInfo).portNumber < 0)) {
    (this->netInfo).portNumber = -1;
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->dataMutex);
  return SUB41(iVar2,0);
}

Assistant:

bool NetworkBroker<COMMS, baseline, tcode>::brokerConnect()
{
    std::lock_guard<std::mutex> lock(dataMutex);
    if ((netInfo.brokerName.empty()) && (netInfo.brokerAddress.empty())) {
        CoreBroker::setAsRoot();
    }
    netInfo.useJsonSerialization = BrokerBase::useJsonSerialization;
    netInfo.observer = BrokerBase::observer;
    CommsBroker<COMMS, CoreBroker>::comms->setName(CoreBroker::getIdentifier());
    CommsBroker<COMMS, CoreBroker>::comms->loadNetworkInfo(netInfo);
    CommsBroker<COMMS, CoreBroker>::comms->setTimeout(BrokerBase::networkTimeout.to_ms());

    auto res = CommsBroker<COMMS, CoreBroker>::comms->connect();
    if (res) {
        if (netInfo.portNumber < 0) {
            netInfo.portNumber = CommsBroker<COMMS, CoreBroker>::comms->getPort();
        }
    }
    return res;
}